

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale.cc
# Opt level: O1

void ScalePlaneBilinearUp
               (int src_width,int src_height,int dst_width,int dst_height,int src_stride,
               int dst_stride,uint8_t *src_ptr,uint8_t *dst_ptr,FilterMode filtering)

{
  uint8_t *puVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  undefined1 uVar6;
  int iVar7;
  code *pcVar8;
  code *pcVar9;
  ulong uVar10;
  int y;
  int local_94;
  code *local_90;
  int x;
  uint8_t *local_80;
  int dx;
  ulong local_70;
  long local_68;
  int local_5c;
  int local_58;
  int dy;
  long local_50;
  uint8_t *local_48;
  code *local_40;
  void *local_38;
  
  local_68 = CONCAT44(local_68._4_4_,src_stride);
  x = 0;
  y = 0;
  dx = 0;
  dy = 0;
  local_80 = (uint8_t *)CONCAT44(local_80._4_4_,src_height);
  local_5c = dst_stride;
  ScaleSlope(src_width,src_height,dst_width,dst_height,filtering,&x,&y,&dx,&dy);
  uVar5 = -src_width;
  if (0 < src_width) {
    uVar5 = src_width;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((dst_width & 0xfU) == 0) {
    pcVar9 = InterpolateRow_SSSE3;
  }
  else {
    pcVar9 = InterpolateRow_Any_SSSE3;
  }
  if ((uVar2 & 0x40) == 0) {
    pcVar9 = InterpolateRow_C;
  }
  uVar2 = cpu_info_;
  if (cpu_info_ == 0) {
    uVar2 = InitCpuFlags();
  }
  if ((dst_width & 0x1fU) == 0) {
    pcVar8 = InterpolateRow_AVX2;
  }
  else {
    pcVar8 = InterpolateRow_Any_AVX2;
  }
  if ((uVar2 >> 10 & 1) == 0) {
    pcVar8 = pcVar9;
  }
  if (uVar5 < 0x8000) {
    local_90 = ScaleFilterCols_C;
  }
  else {
    local_90 = ScaleFilterCols64_C;
  }
  local_94 = (int)local_80 * 0x10000 + -0x10000;
  if (filtering == kFilterNone) {
    local_90 = ScaleCols_C;
  }
  else {
    uVar2 = cpu_info_;
    if (cpu_info_ == 0) {
      uVar2 = InitCpuFlags();
    }
    pcVar9 = local_90;
    if ((uVar2 & 0x40) != 0) {
      pcVar9 = ScaleFilterCols_SSSE3;
    }
    if (uVar5 < 0x8000) {
      local_90 = pcVar9;
    }
  }
  if (filtering == kFilterNone) {
    pcVar9 = local_90;
    if (x < 0x8000) {
      pcVar9 = ScaleColsUp2_C;
    }
    if (uVar5 * 2 == dst_width) {
      local_90 = pcVar9;
    }
  }
  local_48 = src_ptr;
  if (local_94 < y) {
    y = local_94;
  }
  iVar7 = (int)y._2_2_;
  iVar3 = iVar7 * (int)local_68;
  uVar5 = dst_width + 0x1fU & 0xffffffe0;
  local_70 = (ulong)(uint)dst_width;
  local_40 = pcVar8;
  local_38 = malloc((long)(int)(dst_width * 2 + 0x3eU | 0x3f));
  pcVar9 = local_90;
  uVar10 = (long)local_38 + 0x3fU & 0xffffffffffffffc0;
  (*local_90)(uVar10,src_ptr + iVar3,(ulong)(uint)dst_width,x,dx);
  local_50 = (long)(int)local_68;
  lVar4 = 0;
  if (1 < (int)local_80) {
    lVar4 = local_50;
  }
  local_80 = src_ptr + iVar3 + lVar4;
  (*pcVar9)((long)(int)uVar5 + uVar10,local_80,local_70,x,dx);
  if (0 < dst_height) {
    local_80 = local_80 + local_50;
    local_58 = local_94 >> 0x10;
    local_48 = local_48 + (int)local_50 * local_58;
    local_68 = (long)local_5c;
    do {
      if (y >> 0x10 != iVar7) {
        iVar3 = y >> 0x10;
        if (local_94 < y) {
          y = local_94;
          local_80 = local_48;
          iVar3 = local_58;
        }
        puVar1 = local_80;
        if (iVar3 != iVar7) {
          (*local_90)(uVar10,local_80,local_70,x,dx);
          uVar10 = uVar10 + (long)(int)uVar5;
          uVar5 = -uVar5;
          local_80 = puVar1 + local_50;
          iVar7 = iVar3;
        }
      }
      if (filtering == kFilterLinear) {
        lVar4 = 0;
        uVar6 = 0;
      }
      else {
        lVar4 = (long)(int)uVar5;
        uVar6 = y._1_1_;
      }
      (*local_40)(dst_ptr,uVar10,lVar4,local_70,uVar6);
      dst_ptr = dst_ptr + local_68;
      y = y + dy;
      dst_height = dst_height + -1;
    } while (dst_height != 0);
  }
  free(local_38);
  return;
}

Assistant:

void ScalePlaneBilinearUp(int src_width,
                          int src_height,
                          int dst_width,
                          int dst_height,
                          int src_stride,
                          int dst_stride,
                          const uint8_t* src_ptr,
                          uint8_t* dst_ptr,
                          enum FilterMode filtering) {
  int j;
  // Initial source x/y coordinate and step values as 16.16 fixed point.
  int x = 0;
  int y = 0;
  int dx = 0;
  int dy = 0;
  const int max_y = (src_height - 1) << 16;
  void (*InterpolateRow)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                         ptrdiff_t src_stride, int dst_width,
                         int source_y_fraction) = InterpolateRow_C;
  void (*ScaleFilterCols)(uint8_t * dst_ptr, const uint8_t* src_ptr,
                          int dst_width, int x, int dx) =
      filtering ? ScaleFilterCols_C : ScaleCols_C;
  ScaleSlope(src_width, src_height, dst_width, dst_height, filtering, &x, &y,
             &dx, &dy);
  src_width = Abs(src_width);

#if defined(HAS_INTERPOLATEROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3)) {
    InterpolateRow = InterpolateRow_Any_SSSE3;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_SSSE3;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_AVX2)
  if (TestCpuFlag(kCpuHasAVX2)) {
    InterpolateRow = InterpolateRow_Any_AVX2;
    if (IS_ALIGNED(dst_width, 32)) {
      InterpolateRow = InterpolateRow_AVX2;
    }
  }
#endif
#if defined(HAS_INTERPOLATEROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    InterpolateRow = InterpolateRow_Any_NEON;
    if (IS_ALIGNED(dst_width, 16)) {
      InterpolateRow = InterpolateRow_NEON;
    }
  }
#endif

  if (filtering && src_width >= 32768) {
    ScaleFilterCols = ScaleFilterCols64_C;
  }
#if defined(HAS_SCALEFILTERCOLS_SSSE3)
  if (filtering && TestCpuFlag(kCpuHasSSSE3) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_SSSE3;
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_NEON)
  if (filtering && TestCpuFlag(kCpuHasNEON) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_NEON;
    if (IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleFilterCols_NEON;
    }
  }
#endif
#if defined(HAS_SCALEFILTERCOLS_MSA)
  if (filtering && TestCpuFlag(kCpuHasMSA) && src_width < 32768) {
    ScaleFilterCols = ScaleFilterCols_Any_MSA;
    if (IS_ALIGNED(dst_width, 16)) {
      ScaleFilterCols = ScaleFilterCols_MSA;
    }
  }
#endif
  if (!filtering && src_width * 2 == dst_width && x < 0x8000) {
    ScaleFilterCols = ScaleColsUp2_C;
#if defined(HAS_SCALECOLS_SSE2)
    if (TestCpuFlag(kCpuHasSSE2) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_SSE2;
    }
#endif
#if defined(HAS_SCALECOLS_MMI)
    if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(dst_width, 8)) {
      ScaleFilterCols = ScaleColsUp2_MMI;
    }
#endif
  }

  if (y > max_y) {
    y = max_y;
  }
  {
    int yi = y >> 16;
    const uint8_t* src = src_ptr + yi * src_stride;

    // Allocate 2 row buffers.
    const int kRowSize = (dst_width + 31) & ~31;
    align_buffer_64(row, kRowSize * 2);

    uint8_t* rowptr = row;
    int rowstride = kRowSize;
    int lasty = yi;

    ScaleFilterCols(rowptr, src, dst_width, x, dx);
    if (src_height > 1) {
      src += src_stride;
    }
    ScaleFilterCols(rowptr + rowstride, src, dst_width, x, dx);
    src += src_stride;

    for (j = 0; j < dst_height; ++j) {
      yi = y >> 16;
      if (yi != lasty) {
        if (y > max_y) {
          y = max_y;
          yi = y >> 16;
          src = src_ptr + yi * src_stride;
        }
        if (yi != lasty) {
          ScaleFilterCols(rowptr, src, dst_width, x, dx);
          rowptr += rowstride;
          rowstride = -rowstride;
          lasty = yi;
          src += src_stride;
        }
      }
      if (filtering == kFilterLinear) {
        InterpolateRow(dst_ptr, rowptr, 0, dst_width, 0);
      } else {
        int yf = (y >> 8) & 255;
        InterpolateRow(dst_ptr, rowptr, rowstride, dst_width, yf);
      }
      dst_ptr += dst_stride;
      y += dy;
    }
    free_aligned_buffer_64(row);
  }
}